

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::Image::readUsingBuffer
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,void *data)

{
  int *piVar1;
  deInt32 *pdVar2;
  Allocation *pAVar3;
  void *__src;
  undefined8 obj;
  bool bVar4;
  int iVar5;
  VkResult VVar6;
  TextureFormat TVar7;
  VkDeviceSize _size;
  SharedPtr<vkt::Draw::Buffer> stagingResource;
  VkCommandBuffer local_188;
  long *plStack_180;
  deUint32 local_178;
  undefined4 uStack_174;
  undefined8 uStack_170;
  VkSubmitInfo submitInfo;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_110;
  BufferCreateInfo stagingBufferResourceCreateInfo;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  CmdBufferBeginInfo beginInfo;
  undefined8 local_68;
  undefined8 uStack_60;
  VkImageAspectFlagBits local_58;
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  undefined8 local_48;
  deInt32 local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  stagingResource.m_ptr = (Buffer *)0x0;
  stagingResource.m_state = (SharedPtrStateBase *)0x0;
  TVar7 = ::vk::mapVkFormat(this->m_format);
  bVar4 = tcu::isCombinedDepthStencilType(TVar7.type);
  if (bVar4) {
    iVar5 = 0;
    switch(this->m_format) {
    case VK_FORMAT_X8_D24_UNORM_PACK32:
    case VK_FORMAT_D24_UNORM_S8_UINT:
      iVar5 = (uint)(aspect == VK_IMAGE_ASPECT_DEPTH_BIT) * 2 + 1;
      break;
    case VK_FORMAT_D16_UNORM_S8_UINT:
      iVar5 = (aspect == VK_IMAGE_ASPECT_DEPTH_BIT) + 1;
      break;
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
      iVar5 = (uint)(aspect == VK_IMAGE_ASPECT_DEPTH_BIT) * 3 + 1;
    }
  }
  else {
    stagingBufferResourceCreateInfo.super_VkBufferCreateInfo._0_8_ =
         ::vk::mapVkFormat(this->m_format);
    iVar5 = tcu::TextureFormat::getPixelSize((TextureFormat *)&stagingBufferResourceCreateInfo);
  }
  _size = (VkDeviceSize)(iVar5 * depth * height * width);
  BufferCreateInfo::BufferCreateInfo
            (&stagingBufferResourceCreateInfo,_size,3,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,this->m_vk,this->m_device,
             &stagingBufferResourceCreateInfo.super_VkBufferCreateInfo,allocator,
             (MemoryRequirement)0x1);
  if (submitInfo.pNext != (void *)0x0) {
    stagingResource.m_ptr = (Buffer *)submitInfo._0_8_;
    stagingResource.m_state = (SharedPtrStateBase *)submitInfo.pNext;
    LOCK();
    *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
    UNLOCK();
    LOCK();
    *(int *)((long)submitInfo.pNext + 0xc) = *(int *)((long)submitInfo.pNext + 0xc) + 1;
    UNLOCK();
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      piVar1 = (int *)((long)submitInfo.pNext + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        submitInfo._4_4_ = 0;
        (**(code **)(*submitInfo.pNext + 0x10))();
      }
      LOCK();
      piVar1 = (int *)((long)submitInfo.pNext + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (submitInfo.pNext != (void *)0x0)) {
        (**(code **)(*submitInfo.pNext + 8))();
      }
    }
  }
  CmdPoolCreateInfo::CmdPoolCreateInfo(&copyCmdPoolCreateInfo,0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,this->m_vk,this->m_device,
             &copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = submitInfo._0_8_;
  DStack_110.m_device = (VkDevice)submitInfo._16_8_;
  DStack_110.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,this->m_vk,this->m_device,
             (VkCommandPool)submitInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uStack_170 = CONCAT44(submitInfo.pWaitSemaphores._4_4_,submitInfo.pWaitSemaphores._0_4_);
  local_178 = submitInfo.waitSemaphoreCount;
  uStack_174 = submitInfo._20_4_;
  local_188 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_180 = (long *)submitInfo.pNext;
  CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  VVar6 = (*this->m_vk->_vptr_DeviceInterface[0x49])(this->m_vk,local_188,&beginInfo);
  ::vk::checkResult(VVar6,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x138);
  if (layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    submitInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores._0_4_ = 0;
    submitInfo.pWaitSemaphores._4_4_ = 1;
    submitInfo.pWaitDstStageMask._0_4_ = 0xffffffff;
    submitInfo.pWaitDstStageMask._4_4_ = 0xffffffff;
    submitInfo._40_8_ =
         (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)(ulong)aspect;
    submitInfo._60_4_ = 0;
    submitInfo.signalSemaphoreCount = this->m_levelCount;
    submitInfo.pSignalSemaphores =
         (VkSemaphore *)CONCAT44(submitInfo.pSignalSemaphores._4_4_,this->m_layerCount);
    layout = VK_IMAGE_LAYOUT_GENERAL;
    (*this->m_vk->_vptr_DeviceInterface[0x6d])
              (this->m_vk,local_188,0x8000,1,0,0,0,0,0,1,&submitInfo);
  }
  local_68 = 0;
  uStack_60 = 0;
  local_58 = aspect;
  local_54 = mipLevel;
  local_50 = arrayElement;
  local_4c = 1;
  local_3c = width;
  local_38 = height;
  local_34 = depth;
  local_48 = offset._0_8_;
  local_40 = offset.z;
  (*this->m_vk->_vptr_DeviceInterface[99])
            (this->m_vk,local_188,
             (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,(ulong)layout,
             ((stagingResource.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
             m_data.object.m_internal,1,&local_68);
  VVar6 = (*this->m_vk->_vptr_DeviceInterface[0x4a])(this->m_vk,local_188);
  ::vk::checkResult(VVar6,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x15e);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = &local_188;
  (*this->m_vk->_vptr_DeviceInterface[2])(this->m_vk,queue,1,&submitInfo,0);
  VVar6 = (*this->m_vk->_vptr_DeviceInterface[3])(this->m_vk,queue);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x16f);
  if (local_188 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_188;
    (**(code **)(*plStack_180 + 0x240))(plStack_180,_local_178,uStack_170,1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_110,(VkCommandPool)obj);
  }
  pAVar3 = ((stagingResource.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00d1abf8;
  submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
  submitInfo._16_8_ = pAVar3->m_offset;
  __src = pAVar3->m_hostPtr;
  submitInfo.pWaitSemaphores._0_4_ = SUB84(__src,0);
  submitInfo.pWaitSemaphores._4_4_ = (undefined4)((ulong)__src >> 0x20);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  memcpy(data,__src,_size);
  if (stagingBufferResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(stagingBufferResourceCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)stagingBufferResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)stagingBufferResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (stagingResource.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar2 = &(stagingResource.m_state)->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[2])(stagingResource.m_state);
    }
    LOCK();
    pdVar2 = &(stagingResource.m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if ((*pdVar2 == 0) && (stagingResource.m_state != (SharedPtrStateBase *)0x0)) {
      (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void Image::readUsingBuffer (vk::VkQueue				queue,
							 vk::Allocator&				allocator,
							 vk::VkImageLayout			layout,
							 vk::VkOffset3D				offset,
							 int						width,
							 int						height,
							 int						depth,
							 unsigned int				mipLevel,
							 unsigned int				arrayElement,
							 vk::VkImageAspectFlagBits	aspect,
							 void *						data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);;

	de::SharedPtr<Buffer> stagingResource;

	bool isCombinedType = isCombinedDepthStencilType(vk::mapVkFormat(m_format).type);
	vk::VkDeviceSize bufferSize = 0;

	if (!isCombinedType)
		bufferSize = vk::mapVkFormat(m_format).getPixelSize() * width * height * depth;

	if (isCombinedType)
	{
		int pixelSize = 0;
		switch (m_format)
		{
			case vk::VK_FORMAT_D16_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 2 : 1;
				break;
			case  vk::VK_FORMAT_D32_SFLOAT_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 4 : 1;
				break;
			case vk::VK_FORMAT_X8_D24_UNORM_PACK32:
			case vk::VK_FORMAT_D24_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 3 : 1;
				break;

			default:
				DE_FATAL("Not implemented");
		}
		bufferSize = pixelSize*width*height*depth;
	}

	BufferCreateInfo stagingBufferResourceCreateInfo(bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT | vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	stagingResource = Buffer::createAndAlloc(m_vk, m_device, stagingBufferResourceCreateInfo, allocator, vk::MemoryRequirement::HostVisible);

	{
		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		if (layout == vk::VK_IMAGE_LAYOUT_UNDEFINED)
		{
			layout = vk::VK_IMAGE_LAYOUT_GENERAL;

			vk::VkImageMemoryBarrier barrier;
			barrier.sType = vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
			barrier.pNext = DE_NULL;
			barrier.srcAccessMask = 0;
			barrier.dstAccessMask = 0;
			barrier.oldLayout = vk::VK_IMAGE_LAYOUT_UNDEFINED;
			barrier.newLayout = vk::VK_IMAGE_LAYOUT_GENERAL;
			barrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.image = object();

			barrier.subresourceRange.aspectMask = aspect;
			barrier.subresourceRange.baseMipLevel = 0;
			barrier.subresourceRange.levelCount = m_levelCount;
			barrier.subresourceRange.baseArrayLayer = 0;
			barrier.subresourceRange.layerCount = m_layerCount;

			m_vk.cmdPipelineBarrier(*copyCmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
									0, (const vk::VkMemoryBarrier*)DE_NULL,
									0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
									1, &barrier);
		}

		vk::VkBufferImageCopy region =
		{
			0, 0, 0,
			{ (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1 },
			offset,
			{ (deUint32)width, (deUint32)height, (deUint32)depth }
		};

		m_vk.cmdCopyImageToBuffer(*copyCmdBuffer, object(), layout, stagingResource->object(), 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}

	deUint8* destPtr = reinterpret_cast<deUint8*>(stagingResource->getBoundMemory().getHostPtr());
	deMemcpy(data, destPtr, static_cast<size_t>(bufferSize));
}